

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O1

string * __thiscall
bssl::CertPathErrors::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,CertPathErrors *this,ParsedCertificateList *certs)

{
  pointer psVar1;
  string *psVar2;
  bool bVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  pointer pCVar8;
  long lVar9;
  ulong uVar10;
  string other_errors;
  string cert_name_debug_str;
  RDNSequence subject;
  ostringstream result;
  string local_248;
  string local_228;
  RDNSequence local_208;
  string *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = __return_storage_ptr__;
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  pCVar8 = (this->cert_errors_).
           super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cert_errors_).super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar8) {
    lVar9 = 0;
    lVar7 = 0;
    uVar10 = 0;
    do {
      CertErrors::ToDebugString_abi_cxx11_
                (&local_248,
                 (CertErrors *)
                 ((long)&(pCVar8->nodes_).
                         super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar7));
      if (local_248._M_string_length != 0) {
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        local_228._M_string_length = 0;
        local_228.field_2._M_local_buf[0] = '\0';
        psVar1 = (certs->
                 super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((uVar10 < (ulong)((long)(certs->
                                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)
            ) && (*(long *)((long)&(psVar1->
                                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar9) != 0)) {
          local_208.
          super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.
          super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.
          super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar3 = ParseName((Input)*(Span<const_unsigned_char> *)
                                    (*(long *)((long)&(psVar1->
                                                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar9) + 0x98),&local_208);
          if (bVar3) {
            bVar3 = ConvertToRFC2253(&local_208,&local_228);
            if (bVar3) {
              ::std::operator+(&local_1c8," (",&local_228);
              plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1c8);
              plVar6 = plVar4 + 2;
              if ((long *)*plVar4 == plVar6) {
                local_1d8 = *plVar6;
                lStack_1d0 = plVar4[3];
                local_1e8 = &local_1d8;
              }
              else {
                local_1d8 = *plVar6;
                local_1e8 = (long *)*plVar4;
              }
              local_1e0 = plVar4[1];
              *plVar4 = (long)plVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&local_228,(string *)&local_1e8);
              if (local_1e8 != &local_1d8) {
                operator_delete(local_1e8,local_1d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
            }
          }
          ::std::
          vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
          ::~vector(&local_208);
        }
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"----- Certificate i=",0x14);
        poVar5 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_228._M_dataplus._M_p,local_228._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," -----\n",7);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_248._M_dataplus._M_p,
                            local_248._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      uVar10 = uVar10 + 1;
      pCVar8 = (this->cert_errors_).
               super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x18;
      lVar9 = lVar9 + 0x10;
    } while (uVar10 < (ulong)(((long)(this->cert_errors_).
                                     super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 3)
                             * -0x5555555555555555));
  }
  CertErrors::ToDebugString_abi_cxx11_(&local_248,&this->other_errors_);
  psVar2 = local_1f0;
  if (local_248._M_string_length != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"----- Other errors (not certificate specific) -----\n",0x34);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  ::std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string CertPathErrors::ToDebugString(
    const ParsedCertificateList &certs) const {
  std::ostringstream result;

  for (size_t i = 0; i < cert_errors_.size(); ++i) {
    // Pretty print the current CertErrors. If there were no errors/warnings,
    // then continue.
    const CertErrors &errors = cert_errors_[i];
    std::string cert_errors_string = errors.ToDebugString();
    if (cert_errors_string.empty()) {
      continue;
    }

    // Add a header that identifies which certificate this CertErrors pertains
    // to.
    std::string cert_name_debug_str;
    if (i < certs.size() && certs[i]) {
      RDNSequence subject;
      if (ParseName(certs[i]->tbs().subject_tlv, &subject) &&
          ConvertToRFC2253(subject, &cert_name_debug_str)) {
        cert_name_debug_str = " (" + cert_name_debug_str + ")";
      }
    }
    result << "----- Certificate i=" << i << cert_name_debug_str << " -----\n";
    result << cert_errors_string << "\n";
  }

  // Print any other errors that aren't associated with a particular certificate
  // in the chain.
  std::string other_errors = other_errors_.ToDebugString();
  if (!other_errors.empty()) {
    result << "----- Other errors (not certificate specific) -----\n";
    result << other_errors << "\n";
  }

  return result.str();
}